

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

void Abc_NtkDontCareSimulateSetElem2(Odc_Man_t *p)

{
  Odc_Lit_t Lit;
  uint *__s;
  int i;
  uint uVar1;
  ulong uVar2;
  
  for (i = 0; i < p->nVarsMax; i = i + 1) {
    Lit = Odc_Var(p,i);
    __s = Odc_ObjTruth(p,Lit);
    memset(__s,0,(long)p->nWords << 2);
    uVar2 = 0;
    while (uVar1 = (uint)uVar2, (int)uVar1 < p->nBits) {
      if ((uVar1 & 1 << ((byte)i & 0x1f)) != 0) {
        __s[uVar2 >> 5] = __s[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
      }
      uVar2 = (ulong)(uVar1 + 1);
    }
  }
  return;
}

Assistant:

void Abc_NtkDontCareSimulateSetElem2( Odc_Man_t * p )
{
    unsigned * pData;
    int i, k;
    for ( k = 0; k < p->nVarsMax; k++ )
    {
        pData = Odc_ObjTruth( p, Odc_Var(p, k) );
        Abc_InfoClear( pData, p->nWords );
        for ( i = 0; i < p->nBits; i++ )
            if ( i & (1 << k) )
                pData[i>>5] |= (1 << (i&31));
    }
}